

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckFeatures.cpp
# Opt level: O0

bool __thiscall GrcManager::PreCompileLanguages(GrcManager *this,GrcFont *param_2)

{
  size_type_conflict sVar1;
  long in_RDI;
  size_t ilcls;
  GdlRenderer *in_stack_00000040;
  GrcManager *in_stack_00000318;
  GdlLangClass *in_stack_00000320;
  undefined8 local_18;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<GdlLangClass_*,_std::allocator<GdlLangClass_*>_>::size
                      ((vector<GdlLangClass_*,_std::allocator<GdlLangClass_*>_> *)(in_RDI + 200));
    if (sVar1 <= local_18) break;
    std::vector<GdlLangClass_*,_std::allocator<GdlLangClass_*>_>::operator[]
              ((vector<GdlLangClass_*,_std::allocator<GdlLangClass_*>_> *)(in_RDI + 200),local_18);
    GdlLangClass::PreCompile(in_stack_00000320,in_stack_00000318);
    local_18 = local_18 + 1;
  }
  GdlRenderer::CheckLanguageFeatureSize(in_stack_00000040);
  return true;
}

Assistant:

bool GrcManager::PreCompileLanguages(GrcFont * /*pfont*/)
{
	for (size_t ilcls = 0; ilcls < m_vplcls.size(); ilcls++)
		m_vplcls[ilcls]->PreCompile(this);

	m_prndr->CheckLanguageFeatureSize();

	return true;
}